

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

bool __thiscall
CFG::expandReachableSymbols
          (CFG *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *reachableSymbols)

{
  bool bVar1;
  reference ppPVar2;
  string *psVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference pbVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  string local_e0;
  undefined1 local_c0 [8];
  string productionTo;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string local_60;
  Production *local_40;
  Production *production;
  iterator __end1;
  iterator __begin1;
  vector<Production_*,_std::allocator<Production_*>_> *__range1;
  bool changed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *reachableSymbols_local;
  CFG *this_local;
  
  __range1._7_1_ = false;
  __end1 = std::vector<Production_*,_std::allocator<Production_*>_>::begin(&this->productionsP);
  production = (Production *)
               std::vector<Production_*,_std::allocator<Production_*>_>::end(&this->productionsP);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
                                     *)&production), bVar1) {
    ppPVar2 = __gnu_cxx::
              __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
              ::operator*(&__end1);
    local_40 = *ppPVar2;
    psVar3 = Production::getFromP_abi_cxx11_(local_40);
    std::__cxx11::string::string((string *)&local_60,(string *)psVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_78,reachableSymbols);
    bVar1 = inVector(&local_60,&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    std::__cxx11::string::~string((string *)&local_60);
    if (bVar1) {
      this_00 = Production::getToP_abi_cxx11_(local_40);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_00);
      productionTo.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)((long)&productionTo.field_2 + 8)), bVar1) {
        pbVar4 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
        std::__cxx11::string::string((string *)local_c0,(string *)pbVar4);
        std::__cxx11::string::string((string *)&local_e0,(string *)local_c0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_f8,reachableSymbols);
        bVar1 = inVector(&local_e0,&local_f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_f8);
        std::__cxx11::string::~string((string *)&local_e0);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(reachableSymbols,(value_type *)local_c0);
          __range1._7_1_ = true;
        }
        std::__cxx11::string::~string((string *)local_c0);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    __gnu_cxx::
    __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>::
    operator++(&__end1);
  }
  return __range1._7_1_;
}

Assistant:

bool CFG::expandReachableSymbols(std::vector<std::string> &reachableSymbols) {
    bool changed = false;
    for (Production *production: productionsP) {
        if (inVector(production->getFromP(), reachableSymbols)) {
            for (std::string productionTo: production->getToP()) {
                if (!inVector(productionTo, reachableSymbols)) {
                    reachableSymbols.push_back(productionTo);
                    changed = true;
                }
            }
        }
    }
    return changed;
}